

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectMultipleCallsWithMultipleDifferentParametersThatHappenOutOfOrder_Test::
testBody(TEST_MockParameterTest_expectMultipleCallsWithMultipleDifferentParametersThatHappenOutOfOrder_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MockActualCall *pMVar4;
  undefined4 extraout_var_02;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockParameterTest_expectMultipleCallsWithMultipleDifferentParametersThatHappenOutOfOrder_Test
  *local_10;
  TEST_MockParameterTest_expectMultipleCallsWithMultipleDifferentParametersThatHappenOutOfOrder_Test
  *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_40);
  SimpleString::SimpleString(&local_50,"p1");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_50,1);
  SimpleString::SimpleString(&local_60,"p2");
  MockExpectedCall::withParameter(pMVar3,&local_60,2);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_70,"");
  pMVar2 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_80);
  SimpleString::SimpleString(&local_90,"p1");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_00,iVar1),&local_90,1);
  SimpleString::SimpleString(&local_a0,"p2");
  MockExpectedCall::withParameter(pMVar3,&local_a0,0x14);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_c0);
  SimpleString::SimpleString(&local_d0,"p1");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_01,iVar1),&local_d0,1);
  SimpleString::SimpleString(&local_e0,"p2");
  MockActualCall::withParameter(pMVar4,&local_e0,0x14);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_100,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_100);
  SimpleString::SimpleString(&local_110,"p1");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_02,iVar1),&local_110,1);
  SimpleString::SimpleString(&local_120,"p2");
  MockActualCall::withParameter(pMVar4,&local_120,2);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_130);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleCallsWithMultipleDifferentParametersThatHappenOutOfOrder)
{
    mock().expectOneCall("foo").withParameter("p1", 1).withParameter("p2", 2);
    mock().expectOneCall("foo").withParameter("p1", 1).withParameter("p2", 20);

    mock().actualCall("foo").withParameter("p1", 1).withParameter("p2", 20);
    mock().actualCall("foo").withParameter("p1", 1).withParameter("p2", 2);

    mock().checkExpectations();
}